

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webp_enc.c
# Opt level: O1

int WebPEncode(WebPConfig *config,WebPPicture *pic)

{
  int iVar1;
  uint uVar2;
  VP8Encoder *enc;
  bool bVar3;
  float fVar4;
  
  if (pic == (WebPPicture *)0x0) {
    return 0;
  }
  pic->error_code = VP8_ENC_OK;
  if (config == (WebPConfig *)0x0) {
    pic->error_code = VP8_ENC_ERROR_NULL_PARAMETER;
    return 0;
  }
  iVar1 = WebPValidateConfig(config);
  if (iVar1 == 0) {
    pic->error_code = VP8_ENC_ERROR_INVALID_CONFIGURATION;
    return 0;
  }
  if (((pic->width < 1) || (pic->height < 1)) || (0x3fff < pic->width || 0x3fff < pic->height)) {
    pic->error_code = VP8_ENC_ERROR_BAD_DIMENSION;
    return 0;
  }
  if (pic->stats != (WebPAuxStats *)0x0) {
    memset(pic->stats,0,0xbc);
  }
  if (config->lossless != 0) {
    if ((pic->argb == (uint32_t *)0x0) && (iVar1 = WebPPictureYUVAToARGB(pic), iVar1 == 0)) {
      return 0;
    }
    if (config->exact == 0) {
      WebPReplaceTransparentPixels(pic,0);
    }
    iVar1 = VP8LEncodeImage(config,pic);
    return iVar1;
  }
  if (((pic->use_argb != 0) || (pic->y == (uint8_t *)0x0)) ||
     ((pic->u == (uint8_t *)0x0 || (pic->v == (uint8_t *)0x0)))) {
    if ((config->use_sharp_yuv == 0) && ((config->preprocessing & 4U) == 0)) {
      fVar4 = 0.0;
      if ((config->preprocessing & 2U) != 0) {
        fVar4 = config->quality / 100.0;
        fVar4 = fVar4 * fVar4;
        fVar4 = fVar4 * -0.5 * fVar4 + 1.0;
      }
      iVar1 = WebPPictureARGBToYUVADithered(pic,WEBP_YUV420,fVar4);
    }
    else {
      iVar1 = WebPPictureSharpARGBToYUVA(pic);
    }
    if (iVar1 == 0) {
      return 0;
    }
  }
  if (config->exact == 0) {
    WebPCleanupTransparentArea(pic);
  }
  enc = InitVP8Encoder(config,pic);
  if (enc == (VP8Encoder *)0x0) {
    return 0;
  }
  iVar1 = VP8EncAnalyze(enc);
  if (iVar1 == 0) {
    bVar3 = false;
  }
  else {
    iVar1 = VP8EncStartAlpha(enc);
    bVar3 = iVar1 != 0;
  }
  if (enc->use_tokens_ == 0) {
    if (bVar3) {
      iVar1 = VP8EncLoop(enc);
      goto LAB_0012ae87;
    }
  }
  else if (bVar3) {
    iVar1 = VP8EncTokenLoop(enc);
LAB_0012ae87:
    if ((iVar1 != 0) && (iVar1 = VP8EncFinishAlpha(enc), iVar1 != 0)) {
      iVar1 = VP8EncWrite(enc);
      bVar3 = iVar1 != 0;
      goto LAB_0012aea9;
    }
  }
  bVar3 = false;
LAB_0012aea9:
  StoreStats(enc);
  if (!bVar3) {
    VP8EncFreeBitWriters(enc);
  }
  uVar2 = DeleteVP8Encoder(enc);
  return bVar3 & uVar2;
}

Assistant:

int WebPEncode(const WebPConfig* config, WebPPicture* pic) {
  int ok = 0;
  if (pic == NULL) return 0;

  WebPEncodingSetError(pic, VP8_ENC_OK);  // all ok so far
  if (config == NULL) {  // bad params
    return WebPEncodingSetError(pic, VP8_ENC_ERROR_NULL_PARAMETER);
  }
  if (!WebPValidateConfig(config)) {
    return WebPEncodingSetError(pic, VP8_ENC_ERROR_INVALID_CONFIGURATION);
  }
  if (pic->width <= 0 || pic->height <= 0) {
    return WebPEncodingSetError(pic, VP8_ENC_ERROR_BAD_DIMENSION);
  }
  if (pic->width > WEBP_MAX_DIMENSION || pic->height > WEBP_MAX_DIMENSION) {
    return WebPEncodingSetError(pic, VP8_ENC_ERROR_BAD_DIMENSION);
  }

  if (pic->stats != NULL) memset(pic->stats, 0, sizeof(*pic->stats));

  if (!config->lossless) {
    VP8Encoder* enc = NULL;

    if (pic->use_argb || pic->y == NULL || pic->u == NULL || pic->v == NULL) {
      // Make sure we have YUVA samples.
      if (config->use_sharp_yuv || (config->preprocessing & 4)) {
        if (!WebPPictureSharpARGBToYUVA(pic)) {
          return 0;
        }
      } else {
        float dithering = 0.f;
        if (config->preprocessing & 2) {
          const float x = config->quality / 100.f;
          const float x2 = x * x;
          // slowly decreasing from max dithering at low quality (q->0)
          // to 0.5 dithering amplitude at high quality (q->100)
          dithering = 1.0f + (0.5f - 1.0f) * x2 * x2;
        }
        if (!WebPPictureARGBToYUVADithered(pic, WEBP_YUV420, dithering)) {
          return 0;
        }
      }
    }

    if (!config->exact) {
      WebPCleanupTransparentArea(pic);
    }

    enc = InitVP8Encoder(config, pic);
    if (enc == NULL) return 0;  // pic->error is already set.
    // Note: each of the tasks below account for 20% in the progress report.
    ok = VP8EncAnalyze(enc);

    // Analysis is done, proceed to actual coding.
    ok = ok && VP8EncStartAlpha(enc);   // possibly done in parallel
    if (!enc->use_tokens_) {
      ok = ok && VP8EncLoop(enc);
    } else {
      ok = ok && VP8EncTokenLoop(enc);
    }
    ok = ok && VP8EncFinishAlpha(enc);

    ok = ok && VP8EncWrite(enc);
    StoreStats(enc);
    if (!ok) {
      VP8EncFreeBitWriters(enc);
    }
    ok &= DeleteVP8Encoder(enc);  // must always be called, even if !ok
  } else {
    // Make sure we have ARGB samples.
    if (pic->argb == NULL && !WebPPictureYUVAToARGB(pic)) {
      return 0;
    }

    if (!config->exact) {
      WebPReplaceTransparentPixels(pic, 0x000000);
    }

    ok = VP8LEncodeImage(config, pic);  // Sets pic->error in case of problem.
  }

  return ok;
}